

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

void __thiscall
QSslSocket::connectToHostEncrypted
          (QSslSocket *this,QString *hostName,quint16 port,QString *sslPeerName,OpenMode mode,
          NetworkLayerProtocol protocol)

{
  QSslSocketPrivate *this_00;
  bool bVar1;
  QLoggingCategory *pQVar2;
  EVP_PKEY_CTX *ctx;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if (((this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state & ~HostLookupState) ==
      ConnectingState) {
    pQVar2 = QtPrivateLogging::lcSsl();
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      connectToHostEncrypted((QSslSocket *)pQVar2);
    }
  }
  else {
    ctx = (EVP_PKEY_CTX *)hostName;
    bVar1 = QSslSocketPrivate::supportsSsl();
    if (bVar1) {
      QSslSocketPrivate::init(this_00,ctx);
      this_00->autoStartHandshake = true;
      (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f = 1;
      QString::operator=(&this_00->verificationPeerName,(QString *)sslPeerName);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (**(code **)(*(long *)&(this->super_QTcpSocket).super_QAbstractSocket + 0xf8))
                  (this,hostName,port,
                   mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                   super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,protocol);
        return;
      }
      goto LAB_0024be73;
    }
    pQVar2 = QtPrivateLogging::lcSsl();
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      connectToHostEncrypted((QSslSocket *)pQVar2);
    }
    QMetaObject::tr((char *)&local_50,(char *)&staticMetaObject,0x27f41b);
    QAbstractSocketPrivate::setErrorAndEmit
              ((QAbstractSocketPrivate *)this_00,SslInternalError,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0024be73:
  __stack_chk_fail();
}

Assistant:

void QSslSocket::connectToHostEncrypted(const QString &hostName, quint16 port,
                                        const QString &sslPeerName, OpenMode mode,
                                        NetworkLayerProtocol protocol)
{
    Q_D(QSslSocket);
    if (d->state == ConnectedState || d->state == ConnectingState) {
        qCWarning(lcSsl,
                  "QSslSocket::connectToHostEncrypted() called when already connecting/connected");
        return;
    }

    if (!supportsSsl()) {
        qCWarning(lcSsl, "QSslSocket::connectToHostEncrypted: TLS initialization failed");
        d->setErrorAndEmit(QAbstractSocket::SslInternalError, tr("TLS initialization failed"));
        return;
    }

    d->init();
    d->autoStartHandshake = true;
    d->initialized = true;
    d->verificationPeerName = sslPeerName;

    // Note: When connecting to localhost, some platforms (e.g., HP-UX and some BSDs)
    // establish the connection immediately (i.e., first attempt).
    connectToHost(hostName, port, mode, protocol);
}